

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sf::Image::create(Image *this,uint width,uint height,Uint8 *pixels)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> newPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined1 local_60 [8];
  allocator_type *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_31;
  int local_10;
  int local_c;
  
  if (((in_RCX == 0) || (in_ESI == 0)) || (in_EDX == 0)) {
    memset(local_60,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ce465);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff90);
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  else {
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          (in_RCX + (ulong)(uint)(in_ESI * in_EDX * 4));
    this_00 = &local_31;
    local_10 = in_EDX;
    local_c = in_ESI;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1ce3da);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1ce3ff);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap(this_00,__x);
    *in_RDI = local_c;
    in_RDI[1] = local_10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  }
  return;
}

Assistant:

void Image::create(unsigned int width, unsigned int height, const Uint8* pixels)
{
    if (pixels && width && height)
    {
        // Create a new pixel buffer first for exception safety's sake
        std::vector<Uint8> newPixels(pixels, pixels + width * height * 4);
        
        // Commit the new pixel buffer
        m_pixels.swap(newPixels);
        
        // Assign the new size
        m_size.x = width;
        m_size.y = height;
    }
    else
    {
        // Dump the pixel buffer
        std::vector<Uint8>().swap(m_pixels);
        
        // Assign the new size
        m_size.x = 0;
        m_size.y = 0;
    }
}